

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::ClearInputData(ImFontAtlas *this)

{
  ImVector<ImFontConfig> *this_00;
  ImVector<ImFont_*> *this_01;
  ImFontConfig *pIVar1;
  ImFont **ppIVar2;
  int i;
  int iVar3;
  
  if (this->Locked == false) {
    this_00 = &this->ConfigData;
    for (iVar3 = 0; iVar3 < this_00->Size; iVar3 = iVar3 + 1) {
      pIVar1 = ImVector<ImFontConfig>::operator[](this_00,iVar3);
      if (pIVar1->FontData != (void *)0x0) {
        pIVar1 = ImVector<ImFontConfig>::operator[](this_00,iVar3);
        if (pIVar1->FontDataOwnedByAtlas == true) {
          pIVar1 = ImVector<ImFontConfig>::operator[](this_00,iVar3);
          ImGui::MemFree(pIVar1->FontData);
          pIVar1 = ImVector<ImFontConfig>::operator[](this_00,iVar3);
          pIVar1->FontData = (void *)0x0;
        }
      }
    }
    this_01 = &this->Fonts;
    for (iVar3 = 0; iVar3 < this_01->Size; iVar3 = iVar3 + 1) {
      ppIVar2 = ImVector<ImFont_*>::operator[](this_01,iVar3);
      if ((this->ConfigData).Data <= (*ppIVar2)->ConfigData) {
        ppIVar2 = ImVector<ImFont_*>::operator[](this_01,iVar3);
        if ((*ppIVar2)->ConfigData < (this->ConfigData).Data + (this->ConfigData).Size) {
          ppIVar2 = ImVector<ImFont_*>::operator[](this_01,iVar3);
          (*ppIVar2)->ConfigData = (ImFontConfig *)0x0;
          ppIVar2 = ImVector<ImFont_*>::operator[](this_01,iVar3);
          (*ppIVar2)->ConfigDataCount = 0;
        }
      }
    }
    ImVector<ImFontConfig>::clear(this_00);
    ImVector<ImFontAtlasCustomRect>::clear(&this->CustomRects);
    this->CustomRectIds[0] = -1;
    return;
  }
  __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_draw.cpp"
                ,0x5e5,"void ImFontAtlas::ClearInputData()");
}

Assistant:

void    ImFontAtlas::ClearInputData()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    for (int i = 0; i < ConfigData.Size; i++)
        if (ConfigData[i].FontData && ConfigData[i].FontDataOwnedByAtlas)
        {
            IM_FREE(ConfigData[i].FontData);
            ConfigData[i].FontData = NULL;
        }

    // When clearing this we lose access to the font name and other information used to build the font.
    for (int i = 0; i < Fonts.Size; i++)
        if (Fonts[i]->ConfigData >= ConfigData.Data && Fonts[i]->ConfigData < ConfigData.Data + ConfigData.Size)
        {
            Fonts[i]->ConfigData = NULL;
            Fonts[i]->ConfigDataCount = 0;
        }
    ConfigData.clear();
    CustomRects.clear();
    for (int n = 0; n < IM_ARRAYSIZE(CustomRectIds); n++)
        CustomRectIds[n] = -1;
}